

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::do_udp(Server *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  undefined8 extraout_RAX;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  uint __val;
  undefined1 *unaff_R13;
  uint __len;
  long *__src;
  long *unaff_R15;
  string __str;
  sockaddr_un name;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  sockaddr local_9e [6];
  
  __len = 1;
  iVar2 = socket(1,0x802,0);
  this->udp_fd = iVar2;
  if (iVar2 < 0) {
    do_udp();
  }
  else {
    local_9e[0].sa_family = 1;
    uVar3 = getpid();
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    if (9 < __val) {
      uVar7 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar5 = (uint)uVar7;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00104b88;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00104b88;
        }
        if (uVar5 < 10000) goto LAB_00104b88;
        uVar7 = uVar7 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_00104b88:
    unaff_R13 = local_d0;
    local_e0[0] = unaff_R13;
    std::__cxx11::string::_M_construct((ulong)local_e0,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_e0[0] + (uVar3 >> 0x1f),__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_e0,0,(char *)0x0,0x1083fb);
    unaff_R15 = &local_f0;
    local_100 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_100 == plVar6) {
      local_f0 = *plVar6;
      lStack_e8 = plVar4[3];
      local_100 = unaff_R15;
    }
    else {
      local_f0 = *plVar6;
    }
    local_f8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_b0 = *plVar6;
      lStack_a8 = plVar4[3];
      __src = &local_b0;
    }
    else {
      local_b0 = *plVar6;
      __src = (long *)*plVar4;
    }
    local_b8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_c0 = __src;
    strcpy(local_9e[0].sa_data,(char *)__src);
    if (__src != &local_b0) {
      operator_delete(__src);
    }
    if (local_100 != unaff_R15) {
      operator_delete(local_100);
    }
    if (local_e0[0] != unaff_R13) {
      operator_delete(local_e0[0]);
    }
    iVar2 = bind(this->udp_fd,local_9e,0x6e);
    if (-1 < iVar2) {
      return;
    }
  }
  do_udp();
  if (local_100 != unaff_R15) {
    operator_delete(local_100);
  }
  if (local_e0[0] != unaff_R13) {
    operator_delete(local_e0[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Server::do_udp() {
    this->udp_fd = socket(AF_UNIX, SOCK_DGRAM | SOCK_NONBLOCK, 0);
    IF_NEGATIVE_EXIT(this->udp_fd);

    struct sockaddr_un name;

    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(getpid()) + ".sock").c_str());
    IF_NEGATIVE_EXIT(bind(this->udp_fd, (struct sockaddr *) &name, sizeof(struct sockaddr_un)));
}